

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void xmlHashScanFull3(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,
                     xmlHashScannerFull scan,void *data)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  xmlChar *__s2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  int iVar5;
  void *pvVar6;
  xmlHashEntry *pxVar7;
  uint uVar8;
  
  if ((hash != (xmlHashTablePtr)0x0) &&
     (uVar1 = hash->size, scan != (xmlHashScannerFull)0x0 && (ulong)uVar1 != 0)) {
    pxVar2 = hash->table;
    uVar8 = pxVar2->hashValue;
    pxVar7 = pxVar2;
    while (uVar8 != 0) {
      pxVar7 = pxVar7 + 1;
      if (pxVar2 + uVar1 <= pxVar7) {
        pxVar7 = pxVar2;
      }
      uVar8 = pxVar7->hashValue;
    }
    uVar8 = 0;
    do {
      if ((pxVar7->hashValue != 0) && (pvVar6 = pxVar7->payload, pvVar6 != (void *)0x0)) {
        while ((((key == (xmlChar *)0x0 ||
                 (iVar5 = strcmp((char *)key,(char *)pxVar7->key), iVar5 == 0)) &&
                ((key2 == (xmlChar *)0x0 ||
                 ((pxVar7->key2 != (xmlChar *)0x0 &&
                  (iVar5 = strcmp((char *)key2,(char *)pxVar7->key2), iVar5 == 0)))))) &&
               ((__s2 = pxVar7->key3, key3 == (xmlChar *)0x0 ||
                ((__s2 != (xmlChar *)0x0 && (iVar5 = strcmp((char *)key3,(char *)__s2), iVar5 == 0))
                ))))) {
          pxVar3 = pxVar7->key;
          pxVar4 = pxVar7->key2;
          (*scan)(pvVar6,data,pxVar3,pxVar4,__s2);
          if ((pxVar7->hashValue == 0) ||
             ((pvVar6 = pxVar7->payload, pvVar6 == (void *)0x0 ||
              (((pxVar7->key == pxVar3 && (pxVar7->key2 == pxVar4)) && (pxVar7->key3 == __s2))))))
          break;
        }
      }
      pxVar7 = pxVar7 + 1;
      if (pxVar2 + uVar1 <= pxVar7) {
        pxVar7 = hash->table;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < hash->size);
  }
  return;
}

Assistant:

void
xmlHashScanFull3(xmlHashTablePtr hash, const xmlChar *key,
                 const xmlChar *key2, const xmlChar *key3,
                 xmlHashScannerFull scan, void *data) {
    const xmlHashEntry *entry, *end;
    xmlHashEntry old;
    unsigned i;

    if ((hash == NULL) || (hash->size == 0) || (scan == NULL))
        return;

    /*
     * We must handle the case that a scanned entry is removed when executing
     * the callback (xmlCleanSpecialAttr and possibly other places).
     *
     * Find the start of a probe sequence to avoid scanning entries twice if
     * a deletion happens.
     */
    entry = hash->table;
    end = &hash->table[hash->size];
    while (entry->hashValue != 0) {
        if (++entry >= end)
            entry = hash->table;
    }

    for (i = 0; i < hash->size; i++) {
        if ((entry->hashValue != 0) && (entry->payload != NULL)) {
            /*
             * Make sure to rescan after a possible deletion.
             */
            do {
                if (((key != NULL) && (strcmp((const char *) key,
                                              (const char *) entry->key) != 0)) ||
                    ((key2 != NULL) && (!xmlFastStrEqual(key2, entry->key2))) ||
                    ((key3 != NULL) && (!xmlFastStrEqual(key3, entry->key3))))
                    break;
                old = *entry;
                scan(entry->payload, data, entry->key, entry->key2, entry->key3);
            } while ((entry->hashValue != 0) &&
                     (entry->payload != NULL) &&
                     ((entry->key != old.key) ||
                      (entry->key2 != old.key2) ||
                      (entry->key3 != old.key3)));
        }
        if (++entry >= end)
            entry = hash->table;
    }
}